

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O0

void __thiscall
btAxisSweep3Internal<unsigned_short>::removeHandle
          (btAxisSweep3Internal<unsigned_short> *this,unsigned_short handle,btDispatcher *dispatcher
          )

{
  Edge *pEVar1;
  uint uVar2;
  int iVar3;
  Handle *pHVar4;
  undefined8 in_RDX;
  unsigned_short in_SI;
  btAxisSweep3Internal<unsigned_short> *in_RDI;
  bool in_stack_0000000f;
  unsigned_short i;
  btDispatcher *in_stack_00000010;
  unsigned_short max;
  Edge *pEdges;
  int axis;
  int limit;
  Handle *pHandle;
  unsigned_short in_stack_ffffffffffffffbe;
  int local_28;
  
  pHVar4 = getHandle(in_RDI,in_SI);
  uVar2 = (*(in_RDI->m_pairCache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback
            [0xe])();
  if ((uVar2 & 1) == 0) {
    (*(in_RDI->m_pairCache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback[4])
              (in_RDI->m_pairCache,pHVar4,in_RDX);
  }
  iVar3 = (uint)in_RDI->m_numHandles * 2;
  for (local_28 = 0; local_28 < 3; local_28 = local_28 + 1) {
    in_RDI->m_pHandles->m_maxEdges[local_28] = in_RDI->m_pHandles->m_maxEdges[local_28] - 2;
  }
  for (local_28 = 0; local_28 < 3; local_28 = local_28 + 1) {
    pEVar1 = in_RDI->m_pEdges[local_28];
    pEVar1[pHVar4->m_maxEdges[local_28]].m_pos = in_RDI->m_handleSentinel;
    sortMaxUp(_axis,pEdges._4_4_,pEdges._2_2_,in_stack_00000010,in_stack_0000000f);
    pEVar1[pHVar4->m_maxEdges[(long)local_28 + -3]].m_pos = in_RDI->m_handleSentinel;
    sortMinUp(_axis,pEdges._4_4_,pEdges._2_2_,in_stack_00000010,in_stack_0000000f);
    pEVar1[iVar3 + -1].m_handle = 0;
    pEVar1[iVar3 + -1].m_pos = in_RDI->m_handleSentinel;
  }
  freeHandle(in_RDI,in_stack_ffffffffffffffbe);
  return;
}

Assistant:

void btAxisSweep3Internal<BP_FP_INT_TYPE>::removeHandle(BP_FP_INT_TYPE handle,btDispatcher* dispatcher)
{

	Handle* pHandle = getHandle(handle);

	//explicitly remove the pairs containing the proxy
	//we could do it also in the sortMinUp (passing true)
	///@todo: compare performance
	if (!m_pairCache->hasDeferredRemoval())
	{
		m_pairCache->removeOverlappingPairsContainingProxy(pHandle,dispatcher);
	}

	// compute current limit of edge arrays
	int limit = static_cast<int>(m_numHandles * 2);
	
	int axis;

	for (axis = 0;axis<3;axis++)
	{
		m_pHandles[0].m_maxEdges[axis] -= 2;
	}

	// remove the edges by sorting them up to the end of the list
	for ( axis = 0; axis < 3; axis++)
	{
		Edge* pEdges = m_pEdges[axis];
		BP_FP_INT_TYPE max = pHandle->m_maxEdges[axis];
		pEdges[max].m_pos = m_handleSentinel;

		sortMaxUp(axis,max,dispatcher,false);


		BP_FP_INT_TYPE i = pHandle->m_minEdges[axis];
		pEdges[i].m_pos = m_handleSentinel;


		sortMinUp(axis,i,dispatcher,false);

		pEdges[limit-1].m_handle = 0;
		pEdges[limit-1].m_pos = m_handleSentinel;
		
#ifdef DEBUG_BROADPHASE
			debugPrintAxis(axis,false);
#endif //DEBUG_BROADPHASE


	}


	// free the handle
	freeHandle(handle);

	
}